

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmlookup.cpp
# Opt level: O0

void __thiscall vm_lookup_ext::init_ext(vm_lookup_ext *this)

{
  int *in_RDI;
  vm_lookup_val *valp;
  vm_lookup_val **bucketp;
  uint i;
  vm_val_t *local_20;
  vm_val_t *local_18;
  int local_c;
  
  local_18 = (vm_val_t *)(in_RDI + 8);
  for (local_c = *in_RDI; local_c != 0; local_c = local_c + -1) {
    *(undefined8 *)local_18 = 0;
    local_18 = (vm_val_t *)&local_18->val;
  }
  local_20 = local_18;
  *(vm_val_t **)(in_RDI + 2) = local_18;
  *(vm_val_t **)(in_RDI + 2) = local_18;
  for (local_c = in_RDI[1]; local_c != 0; local_c = local_c + -1) {
    *(anon_union_8_8_cb74652f_for_val **)(local_20 + 2) = &local_20[2].val;
    vm_val_t::set_empty(local_20);
    vm_val_t::set_empty(local_20 + 1);
    local_20 = (vm_val_t *)&local_20[2].val;
  }
  local_20[-1].val.ptr = (void *)0x0;
  return;
}

Assistant:

void vm_lookup_ext::init_ext()
{
    uint i;
    vm_lookup_val **bucketp;
    vm_lookup_val *valp;

    /* all of the buckets are initially empty */
    for (i = bucket_cnt, bucketp = buckets ; i != 0 ; --i, ++bucketp)
        *bucketp = 0;

    /* 
     *   Initialize the value free list.  We suballocate the value entry
     *   structures out of our main allocation block; the available memory
     *   for the structures comes immediately after the last bucket, so
     *   bucketp points to the first value entry. 
     */
    valp = (vm_lookup_val *)(void *)bucketp;
    first_free = valp;
    for (first_free = valp, i = value_cnt ; i != 0 ; --i, ++valp)
    {
        /* link it into the free list */
        valp->nxt = valp + 1;

        /* mark it as empty */
        valp->key.set_empty();
        valp->val.set_empty();
    }

    /* terminate the free list at the last element */
    (valp - 1)->nxt = 0;
}